

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> __thiscall
enact::Parser::expectTypenamePrecFunction(Parser *this,string *msg,bool emptyAllowed)

{
  CompileContext *pCVar1;
  pointer puVar2;
  bool bVar3;
  int iVar4;
  enact *this_00;
  vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  *cloneables;
  allocator<char> local_61;
  undefined1 local_60 [8];
  vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  local_58;
  vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  parameterTypenames;
  
  expectTypenamePrecUnary(this,msg,emptyAllowed);
  bVar3 = consume((Parser *)msg,EQUAL_GREATER);
  if (bVar3) {
    parameterTypenames.
    super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    parameterTypenames.
    super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    parameterTypenames.
    super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    iVar4 = (**(code **)((this->m_context->m_source)._M_dataplus._M_p + 0x18))();
    if (iVar4 == 3) {
      pCVar1 = this->m_context;
      this->m_context = (CompileContext *)0x0;
      this_00 = (enact *)TupleTypename::elementTypenames((TupleTypename *)pCVar1);
      cloneAll<enact::Typename_const>(&local_58,this_00,cloneables);
      std::
      vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
      ::_M_move_assign(&parameterTypenames,&local_58);
      std::
      vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
      ::~vector(&local_58);
      (**(_func_int **)((long)(pCVar1->m_source)._M_dataplus._M_p + 8))(pCVar1);
    }
    else {
      std::
      vector<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>,std::allocator<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>>>
      ::
      emplace_back<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>>
                ((vector<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>,std::allocator<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>>>
                  *)&parameterTypenames,
                 (unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *)
                 this);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"Expected return typename after \'=>\'.",&local_61);
    expectTypenamePrecFunction((Parser *)local_60,msg,SUB81(&local_58,0));
    std::__cxx11::string::~string((string *)&local_58);
    std::
    make_unique<enact::FunctionTypename,std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>,std::vector<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>,std::allocator<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>>>>
              ((unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *)
               &local_58,
               (vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
                *)local_60);
    puVar2 = local_58.
             super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_58.
    super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    pCVar1 = this->m_context;
    this->m_context = (CompileContext *)puVar2;
    if (pCVar1 != (CompileContext *)0x0) {
      (**(code **)((pCVar1->m_source)._M_dataplus._M_p + 8))();
      if (local_58.
          super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)((long)(local_58.
                            super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_t + 8))();
      }
    }
    if (local_60 != (undefined1  [8])0x0) {
      (**(code **)((((string *)local_60)->_M_dataplus)._M_p + 8))();
    }
    std::
    vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
    ::~vector(&parameterTypenames);
  }
  return (__uniq_ptr_data<const_enact::Typename,_std::default_delete<const_enact::Typename>,_true,_true>
          )(__uniq_ptr_data<const_enact::Typename,_std::default_delete<const_enact::Typename>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<const Typename> Parser::expectTypenamePrecFunction(const std::string& msg, bool emptyAllowed) {
        std::unique_ptr<const Typename> typename_ = expectTypenamePrecUnary(msg, emptyAllowed);

        if (consume(TokenType::EQUAL_GREATER)) {
            std::vector<std::unique_ptr<const Typename>> parameterTypenames;
            if (typename_->kind() == Typename::Kind::TUPLE) {
                parameterTypenames = cloneAll(
                        static_unique_ptr_cast<const TupleTypename>(
                                std::move(typename_))
                                ->elementTypenames());
            } else {
                parameterTypenames.push_back(std::move(typename_));
            }

            std::unique_ptr<const Typename> returnTypename =
                    expectTypename("Expected return typename after '=>'.");

            typename_ = std::make_unique<FunctionTypename>(std::move(returnTypename), std::move(parameterTypenames));
        }

        return typename_;
    }